

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_evaluator.hpp
# Opt level: O0

optional<unsigned_long> __thiscall
jsoncons::jsonpath::detail::
token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>
::arity(token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>
        *this)

{
  string *s;
  undefined8 extraout_RDX;
  int *in_RDI;
  optional<unsigned_long> oVar2;
  assertion_error *this_00;
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  _Storage<unsigned_long,_true> local_10;
  undefined1 local_8;
  undefined8 uVar1;
  
  if (*in_RDI == 0xf) {
    if (*(long *)(in_RDI + 2) == 0) {
      s = (string *)__cxa_allocate_exception(0x10);
      this_00 = (assertion_error *)&stack0xffffffffffffffc7;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
      assertion_error::assertion_error(this_00,s);
      __cxa_throw(s,&assertion_error::typeinfo,assertion_error::~assertion_error);
    }
    oVar2 = function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
            ::arity(*(function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                      **)(in_RDI + 2));
    uVar1 = oVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_long>._8_8_;
    local_10._M_value =
         oVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_payload;
    local_8 = oVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_long>._M_engaged;
  }
  else {
    std::optional<unsigned_long>::optional((optional<unsigned_long> *)0x6ee6be);
    uVar1 = extraout_RDX;
  }
  oVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._9_7_ = (undefined7)((ulong)uVar1 >> 8);
  oVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_engaged = (bool)local_8;
  oVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = local_10._M_value;
  return (optional<unsigned_long>)
         oVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

jsoncons::optional<std::size_t> arity() const
        {
            if (token_kind_ == jsonpath_token_kind::function)
            {
                JSONCONS_ASSERT(function_ != nullptr);
                return function_->arity();
            }
            return jsoncons::optional<std::size_t>();
        }